

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding_function.cpp
# Opt level: O3

void duckdb::DecodeLatin1ToUTF8
               (CSVEncoderBuffer *encoded_buffer,char *target_buffer,
               idx_t *target_buffer_current_position,idx_t target_buffer_size,
               char *remaining_bytes_buffer,idx_t *remaining_bytes_size,
               EncodingFunction *encoding_function)

{
  char *pcVar1;
  InvalidInputException *this;
  byte bVar2;
  ulong uVar3;
  idx_t iVar4;
  string local_50;
  
  pcVar1 = CSVEncoderBuffer::Ptr(encoded_buffer);
  uVar3 = encoded_buffer->cur_pos;
  while( true ) {
    if (encoded_buffer->actual_encoded_buffer_size <= uVar3) {
      return;
    }
    iVar4 = *target_buffer_current_position;
    if (iVar4 == target_buffer_size) break;
    bVar2 = pcVar1[uVar3];
    if ((char)bVar2 < -0x60) {
      this = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"File is not latin-1 encoded","");
      InvalidInputException::InvalidInputException(this,&local_50);
      __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((char)bVar2 < '\0') {
      *target_buffer_current_position = iVar4 + 1;
      target_buffer[iVar4] = 0xbf < bVar2 | 0xc2;
      iVar4 = *target_buffer_current_position;
      if (iVar4 == target_buffer_size) {
        encoded_buffer->cur_pos = encoded_buffer->cur_pos + 1;
        *remaining_bytes_buffer = bVar2 & 0xbf;
        *remaining_bytes_size = 1;
        return;
      }
      bVar2 = bVar2 & 0xbf;
    }
    *target_buffer_current_position = iVar4 + 1;
    target_buffer[iVar4] = bVar2;
    uVar3 = encoded_buffer->cur_pos + 1;
    encoded_buffer->cur_pos = uVar3;
  }
  return;
}

Assistant:

void DecodeLatin1ToUTF8(CSVEncoderBuffer &encoded_buffer, char *target_buffer, idx_t &target_buffer_current_position,
                        const idx_t target_buffer_size, char *remaining_bytes_buffer, idx_t &remaining_bytes_size,
                        EncodingFunction *encoding_function) {
	auto encoded_ptr = encoded_buffer.Ptr();
	for (; encoded_buffer.cur_pos < encoded_buffer.actual_encoded_buffer_size; encoded_buffer.cur_pos++) {
		if (target_buffer_current_position == target_buffer_size) {
			// We are done
			return;
		}
		const unsigned char ch = static_cast<unsigned char>(encoded_ptr[encoded_buffer.cur_pos]);
		if (ch > 0x7F && ch <= 0x9F) {
			throw InvalidInputException("File is not latin-1 encoded");
		}
		if (ch <= 0x7F) {
			// ASCII: 1 byte in UTF-8
			target_buffer[target_buffer_current_position++] = static_cast<char>(ch);
		} else {
			// Non-ASCII: 2 bytes in UTF-8
			target_buffer[target_buffer_current_position++] = static_cast<char>(0xc2 + (ch > 0xbf));
			if (target_buffer_current_position == target_buffer_size) {
				// We are done, but we have to store one byte for the next chunk!
				encoded_buffer.cur_pos++;
				remaining_bytes_buffer[0] = static_cast<char>((ch & 0x3f) + 0x80);
				remaining_bytes_size = 1;
				return;
			}
			target_buffer[target_buffer_current_position++] = static_cast<char>((ch & 0x3f) + 0x80);
		}
	}
}